

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::CreateSortKeyHelpers::CreateSortKeyWithValidity
               (Vector *input,Vector *result,OrderModifiers *modifiers,idx_t count)

{
  idx_t iVar1;
  idx_t i;
  idx_t row_idx;
  UnifiedVectorFormat format;
  UnifiedVectorFormat local_68;
  
  CreateSortKey(input,count,*modifiers,result);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(input,count,&local_68);
  FlatVector::VerifyFlatVector(result);
  for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
    iVar1 = row_idx;
    if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
      iVar1 = (idx_t)(local_68.sel)->sel_vector[row_idx];
    }
    if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
         (unsigned_long *)0x0) &&
       ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar1 >> 6] >>
         (iVar1 & 0x3f) & 1) == 0)) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
  return;
}

Assistant:

void CreateSortKeyHelpers::CreateSortKeyWithValidity(Vector &input, Vector &result, const OrderModifiers &modifiers,
                                                     const idx_t count) {
	CreateSortKey(input, count, modifiers, result);
	UnifiedVectorFormat format;
	input.ToUnifiedFormat(count, format);
	auto &validity = FlatVector::Validity(result);

	for (idx_t i = 0; i < count; i++) {
		auto idx = format.sel->get_index(i);
		if (!format.validity.RowIsValid(idx)) {
			validity.SetInvalid(i);
		}
	}
}